

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O3

bool __thiscall
QtPrivate::QCalendarTextNavigator::eventFilter(QCalendarTextNavigator *this,QObject *o,QEvent *e)

{
  QArrayData *pQVar1;
  long lVar2;
  QArrayData *pQVar3;
  ushort *puVar4;
  byte bVar5;
  undefined1 uVar6;
  char cVar7;
  
  if ((this->m_widget == (QWidget *)0x0) || ((*(ushort *)(e + 8) & 0xfffe) != 6)) {
LAB_003c79b7:
    uVar6 = QObject::eventFilter(&this->super_QObject,(QEvent *)o);
    return (bool)uVar6;
  }
  pQVar1 = *(QArrayData **)(e + 0x28);
  lVar2 = *(long *)(e + 0x38);
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if (lVar2 == 0) {
    bVar5 = this->m_dateFrame != (QFrame *)0x0;
  }
  else {
    pQVar3 = *(QArrayData **)(e + 0x28);
    puVar4 = *(ushort **)(e + 0x30);
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    bVar5 = QChar::isPrint((uint)*puVar4);
    bVar5 = this->m_dateFrame != (QFrame *)0x0 | bVar5;
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar3,2,0x10);
      }
    }
  }
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar1,2,0x10);
    }
  }
  if (bVar5 == 0) goto LAB_003c79b7;
  if ((*(int *)(e + 0x40) + 0xfefffffcU < 2) || (*(int *)(e + 0x40) == 0x1010000)) {
    applyDate(this);
    QMetaObject::activate(&this->super_QObject,&staticMetaObject,1,(void **)0x0);
  }
  else {
    cVar7 = QKeyEvent::matches((StandardKey)e);
    if (cVar7 == '\0') {
      if (*(short *)(e + 8) == 6) {
        createDateLabel(this);
        QCalendarDateValidator::handleKeyEvent
                  (this->m_dateValidator,e,*(undefined8 *)&this->m_calendar);
        updateDateLabel(this);
      }
      goto LAB_003c79a2;
    }
  }
  removeDateLabel(this);
LAB_003c79a2:
  e[0xc] = (QEvent)0x1;
  return true;
}

Assistant:

bool QCalendarTextNavigator::eventFilter(QObject *o, QEvent *e)
{
    if (m_widget) {
        if (e->type() == QEvent::KeyPress || e->type() == QEvent::KeyRelease) {
            QKeyEvent *ke = static_cast<QKeyEvent *>(e);
            if ((ke->text().size() > 0 && ke->text().at(0).isPrint()) || m_dateFrame) {
                if (ke->key() == Qt::Key_Return || ke->key() == Qt::Key_Enter || ke->key() == Qt::Key_Select) {
                    applyDate();
                    emit editingFinished();
                    removeDateLabel();
#if QT_CONFIG(shortcut)
                } else if (ke->matches(QKeySequence::Cancel)) {
                    removeDateLabel();
#endif
                } else if (e->type() == QEvent::KeyPress) {
                    createDateLabel();
                    m_dateValidator->handleKeyEvent(ke, m_calendar);
                    updateDateLabel();
                }
                ke->accept();
                return true;
            }
            // If we are navigating let the user finish his date in old locate.
            // If we change our mind and want it to update immediately simply uncomment below
            /*
        } else if (e->type() == QEvent::LocaleChange) {
            if (m_dateValidator) {
                m_dateValidator->setLocale(m_widget->locale());
                m_dateValidator->setFormat(m_widget->locale().dateFormat(QLocale::ShortFormat));
                updateDateLabel();
            }
            */
        }
    }
    return QObject::eventFilter(o,e);
}